

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::SampleMean
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  int iVar1;
  pointer pmVar2;
  long lVar3;
  pointer piVar4;
  pointer piVar5;
  mapped_type_conflict3 *pmVar6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  code *pcVar9;
  _Rb_tree_node_base *p_Var10;
  undefined4 in_register_0000000c;
  long *plVar11;
  value_type_conflict3 *pvVar12;
  float fVar13;
  int in_stack_00000008;
  pair<const_outkey2,_OutLosses> x_1;
  pair<const_summary_id_period_key,_float> s;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  mean_map;
  map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
  items;
  key_type local_e8;
  value_type_conflict3 vStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_d0;
  vector<int,_std::allocator<int>_> *local_b0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  local_a8;
  _Base_ptr local_78;
  _Base_ptr local_70;
  key_type local_68;
  _Rb_tree<summary_id_period_key,_std::pair<const_summary_id_period_key,_float>,_std::_Select1st<std::pair<const_summary_id_period_key,_float>_>,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
  local_60;
  
  local_b0 = fileIDs;
  if (this->samplesize_ != 0) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    pmVar2 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    plVar11 = (long *)(&local_a8._M_impl.super__Rb_tree_header._M_header.field_0x4 +
                      CONCAT44(in_register_0000000c,epcalc));
    for (p_Var7 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var7 != &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      local_a8._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           CONCAT44(local_a8._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                    *(undefined4 *)&p_Var7[1]._M_left);
      p_Var10 = p_Var7 + 1;
      local_a8._M_impl._0_4_ = p_Var10->_M_color;
      local_a8._M_impl._4_4_ = *(undefined4 *)&p_Var7[1].field_0x4;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_color =
           *(_Rb_tree_color *)&p_Var7[1]._M_parent;
      local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ =
           *(undefined4 *)((long)&p_Var7[1]._M_parent + 4);
      local_d0.first = p_Var10->_M_color;
      local_d0._4_4_ = *(undefined4 *)&p_Var10->field_0x4;
      pcVar9 = (code *)GetOutLoss;
      if ((GetOutLoss & 1) != 0) {
        pcVar9 = *(code **)(*plVar11 + -1 + GetOutLoss);
      }
      fVar13 = (float)(*pcVar9)(plVar11);
      iVar1 = this->samplesize_;
      pmVar6 = std::
               map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
               ::operator[]((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                             *)&local_60,(key_type *)&local_d0);
      *pmVar6 = fVar13 / (float)iVar1 + *pmVar6;
    }
    local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a8._M_impl.super__Rb_tree_header._M_header;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      local_d0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = *(undefined4 *)&p_Var7[1]._M_parent;
      local_d0.first = p_Var7[1]._M_color;
      local_d0._4_4_ = *(undefined4 *)&p_Var7[1].field_0x4;
      pmVar8 = std::
               map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                             *)&local_a8,&local_d0.first);
      std::vector<float,_std::allocator<float>_>::push_back
                (pmVar8,(value_type_conflict3 *)&local_d0.second);
    }
    WriteExceedanceProbabilityTable
              (this,local_b0,
               (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                *)&local_a8,(double)this->totalperiods_,eptype,eptype_tvar,in_stack_00000008,1);
    if ((this->ordFlag_ == false) &&
       ((this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      local_78 = &(this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header;
      plVar11 = (long *)((long)&uStack_dc + CONCAT44(in_register_0000000c,epcalc));
      p_Var7 = (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (p_Var7 != local_78) {
        local_70 = p_Var7;
        std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair
                  (&local_d0,
                   (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)(p_Var7 + 1));
        std::
        _Rb_tree<summary_id_period_key,_std::pair<const_summary_id_period_key,_float>,_std::_Select1st<std::pair<const_summary_id_period_key,_float>_>,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
        ::clear(&local_60);
        pmVar2 = (this->out_loss_->
                 super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        for (p_Var10 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
            piVar4 = local_d0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
            p_Var10 != &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
          local_d8 = *(undefined4 *)&p_Var10[1]._M_left;
          local_e8.summary_id = p_Var10[1]._M_color;
          local_e8.period_no = *(int *)&p_Var10[1].field_0x4;
          vStack_e0 = *(value_type_conflict3 *)&p_Var10[1]._M_parent;
          uStack_dc = *(undefined4 *)((long)&p_Var10[1]._M_parent + 4);
          for (pvVar12 = (value_type_conflict3 *)
                         CONCAT44(local_d0.second.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_d0.second.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_);
              pvVar12 != (value_type_conflict3 *)piVar4; pvVar12 = pvVar12 + 1) {
            if (vStack_e0 == *pvVar12) {
              local_68 = local_e8;
              pcVar9 = (code *)GetOutLoss;
              if ((GetOutLoss & 1) != 0) {
                pcVar9 = *(code **)(*plVar11 + -1 + GetOutLoss);
              }
              fVar13 = (float)(*pcVar9)(plVar11);
              piVar5 = local_d0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              lVar3 = CONCAT44(local_d0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,
                               local_d0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start._0_4_);
              pmVar6 = std::
                       map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                       ::operator[]((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                                     *)&local_60,&local_68);
              *pmVar6 = fVar13 / (float)(ulong)((long)piVar5 - lVar3 >> 2) + *pmVar6;
            }
          }
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
        ::clear(&local_a8);
        for (p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header;
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
          vStack_e0 = *(value_type_conflict3 *)&p_Var7[1]._M_parent;
          local_e8.summary_id = p_Var7[1]._M_color;
          local_e8.period_no = *(int *)&p_Var7[1].field_0x4;
          pmVar8 = std::
                   map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                   ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                 *)&local_a8,&local_e8.summary_id);
          std::vector<float,_std::allocator<float>_>::push_back(pmVar8,&vStack_e0);
        }
        WriteExceedanceProbabilityTable
                  (this,local_b0,
                   (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                    *)&local_a8,(double)this->totalperiods_,eptype,local_d0.first,in_stack_00000008,
                   1);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&local_d0.second.super__Vector_base<int,_std::allocator<int>_>);
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_70);
      }
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::~_Rb_tree(&local_a8);
    std::
    _Rb_tree<summary_id_period_key,_std::pair<const_summary_id_period_key,_float>,_std::_Select1st<std::pair<const_summary_id_period_key,_float>_>,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void aggreports::SampleMean(const std::vector<int> &fileIDs,
			    OASIS_FLOAT (OutLosses::*GetOutLoss)(),
			    const int epcalc, const int eptype,
			    const int eptype_tvar) {

  if (samplesize_ == 0) return;   // Prevent division by zero error

  std::map<summary_id_period_key, OASIS_FLOAT> items;
  for (auto x : (*out_loss_)[SAMPLES]) {
    summary_id_period_key sk;
    sk.summary_id = x.first.summary_id;
    sk.period_no = x.first.period_no;
    items[sk] += ((x.second.*GetOutLoss)() / samplesize_);
  }

  std::map<int, lossvec> mean_map;
  for (auto s : items) {
    mean_map[s.first.summary_id].push_back(s.second);
  }

  WriteExceedanceProbabilityTable(fileIDs, mean_map, totalperiods_, epcalc,
				  eptype, eptype_tvar);

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      items.clear();
      for (auto x : (*out_loss_)[SAMPLES]) {
	for (auto sidx : ensemble.second) {
	  if (x.first.sidx == sidx) {
	    summary_id_period_key sk;
	    sk.summary_id = x.first.summary_id;
	    sk.period_no = x.first.period_no;
	    items[sk] += ((x.second.*GetOutLoss)() / ensemble.second.size());
	  }
	}
      }
      mean_map.clear();
      for (auto s : items) {
	mean_map[s.first.summary_id].push_back(s.second);
      }
      WriteExceedanceProbabilityTable(fileIDs, mean_map, totalperiods_, epcalc,
				      ensemble.first, eptype_tvar, 1);
    }
  }

}